

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtTxInIndex(void *handle,void *psbt_handle,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  CfdException *this;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  uint32_t *in_R8;
  CfdException *except;
  exception *std_except;
  OutPoint outpoint;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  string *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe00;
  OutPoint *in_stack_fffffffffffffe18;
  Psbt *in_stack_fffffffffffffe20;
  allocator local_1a1;
  string local_1a0;
  Txid local_180;
  OutPoint local_160;
  undefined1 local_132;
  allocator local_131;
  string local_130 [24];
  string *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  uint32_t *local_30;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PsbtHandle",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x5d4;
    local_90.funcname = "CfdGetPsbtTxInIndex";
    cfd::core::logger::warn<>(&local_90,"txid is null or empty.");
    local_b2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. txid is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,error_code,in_stack_fffffffffffffdf0);
    local_b2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (uint32_t *)0x0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x5da;
    local_d0.funcname = "CfdGetPsbtTxInIndex";
    cfd::core::logger::warn<>(&local_d0,"index is null.");
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. index is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe00,error_code,in_stack_fffffffffffffdf0);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_78 + 0x18) == 0) {
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
            ,0x2f);
    cfd::core::logger::warn<>((CfdSourceLocation *)&stack0xfffffffffffffef0,"psbt is null.");
    local_132 = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Failed to handle statement. psbt is null.",&local_131);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffdf0);
    local_132 = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar4 = &local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,local_20,paVar4);
  cfd::core::Txid::Txid(&local_180,&local_1a0);
  cfd::core::OutPoint::OutPoint(&local_160,&local_180,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5f65dd);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  uVar2 = cfd::Psbt::GetTxInIndex(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  *local_30 = uVar2;
  local_4 = 0;
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5f663c);
  return local_4;
}

Assistant:

int CfdGetPsbtTxInIndex(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (index == nullptr) {
      warn(CFD_LOG_SOURCE, "index is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. index is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    *index = psbt_obj->psbt->GetTxInIndex(outpoint);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}